

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBToARGB1555Row_C(uint8_t *src_argb,uint8_t *dst_rgb,int width)

{
  uint8_t a0_1;
  uint8_t r0_1;
  uint8_t g0_1;
  uint8_t b0_1;
  uint8_t a1;
  uint8_t r1;
  uint8_t g1;
  uint8_t b1;
  uint8_t a0;
  uint8_t r0;
  uint8_t g0;
  uint8_t b0;
  int x;
  int width_local;
  uint8_t *dst_rgb_local;
  uint8_t *src_argb_local;
  
  dst_rgb_local = dst_rgb;
  src_argb_local = src_argb;
  for (x = 0; x < width + -1; x = x + 2) {
    *(int *)dst_rgb_local =
         (int)(uint)*src_argb_local >> 3 | ((int)(uint)src_argb_local[1] >> 3) << 5 |
         ((int)(uint)src_argb_local[2] >> 3) << 10 | ((int)(uint)src_argb_local[3] >> 7) << 0xf |
         ((int)(uint)src_argb_local[4] >> 3) << 0x10 | ((int)(uint)src_argb_local[5] >> 3) << 0x15 |
         ((int)(uint)src_argb_local[6] >> 3) << 0x1a | ((int)(uint)src_argb_local[7] >> 7) << 0x1f;
    dst_rgb_local = dst_rgb_local + 4;
    src_argb_local = src_argb_local + 8;
  }
  if ((width & 1U) != 0) {
    *(ushort *)dst_rgb_local =
         (ushort)(byte)((int)(uint)*src_argb_local >> 3) |
         (ushort)(byte)((int)(uint)src_argb_local[1] >> 3) << 5 |
         (ushort)(byte)((int)(uint)src_argb_local[2] >> 3) << 10 |
         (ushort)(byte)((int)(uint)src_argb_local[3] >> 7) << 0xf;
  }
  return;
}

Assistant:

void ARGBToARGB1555Row_C(const uint8_t* src_argb, uint8_t* dst_rgb, int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint8_t b0 = src_argb[0] >> 3;
    uint8_t g0 = src_argb[1] >> 3;
    uint8_t r0 = src_argb[2] >> 3;
    uint8_t a0 = src_argb[3] >> 7;
    uint8_t b1 = src_argb[4] >> 3;
    uint8_t g1 = src_argb[5] >> 3;
    uint8_t r1 = src_argb[6] >> 3;
    uint8_t a1 = src_argb[7] >> 7;
    *(uint32_t*)(dst_rgb) = b0 | (g0 << 5) | (r0 << 10) | (a0 << 15) |
                            (b1 << 16) | (g1 << 21) | (r1 << 26) | (a1 << 31);
    dst_rgb += 4;
    src_argb += 8;
  }
  if (width & 1) {
    uint8_t b0 = src_argb[0] >> 3;
    uint8_t g0 = src_argb[1] >> 3;
    uint8_t r0 = src_argb[2] >> 3;
    uint8_t a0 = src_argb[3] >> 7;
    *(uint16_t*)(dst_rgb) = b0 | (g0 << 5) | (r0 << 10) | (a0 << 15);
  }
}